

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall mkvmuxer::Tags::~Tags(Tags *this)

{
  Tag *pTVar1;
  uint uVar2;
  
  while( true ) {
    pTVar1 = this->tags_;
    if (this->tags_count_ < 1) break;
    uVar2 = this->tags_count_ - 1;
    this->tags_count_ = uVar2;
    Tag::Clear(pTVar1 + uVar2);
  }
  if (pTVar1 != (Tag *)0x0) {
    operator_delete__(&pTVar1[-1].simple_tags_size_);
  }
  this->tags_ = (Tag *)0x0;
  return;
}

Assistant:

Tags::~Tags() {
  while (tags_count_ > 0) {
    Tag& tag = tags_[--tags_count_];
    tag.Clear();
  }

  delete[] tags_;
  tags_ = NULL;
}